

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hpack.cpp
# Opt level: O0

Header * __thiscall
Hpack::decodeHTTP2Header
          (Header *__return_storage_ptr__,Hpack *this,char *receivedPayload,uint length)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint uStack_254;
  bool continuation;
  uint m;
  uint dynamicTableSizeUpdate;
  string local_230;
  undefined1 local_210 [8];
  string valueString_2;
  size_t j_2;
  char *stringData_2;
  bool huffman_2;
  uint nameLength_2;
  uint index_3;
  string local_1b0;
  undefined1 local_190 [8];
  string valueString_1;
  size_t j_1;
  char *stringData_1;
  bool huffman_1;
  uint nameLength_1;
  uint index_2;
  string local_130;
  undefined1 local_110 [8];
  string valueString;
  size_t j;
  char *stringData;
  bool huffman;
  uint nameLength;
  uint index_1;
  string local_b0;
  undefined1 local_90 [8];
  StaticTableLine line;
  uint local_40;
  uint index;
  uint i;
  uint local_2c;
  uint iterator;
  uint length_local;
  char *receivedPayload_local;
  Hpack *this_local;
  Header *header;
  
  Header::Header(__return_storage_ptr__);
  local_2c = 0;
  poVar5 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar5,"Header binary: ");
  for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
    std::ostream::operator<<(poVar5,(uint)(byte)receivedPayload[local_40]);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  while (local_2c < length) {
    if ((int)((int)receivedPayload[local_2c] & 0x80U) >> 7 == 0) {
      if (((int)receivedPayload[local_2c] & 0xc0U) == 0x40) {
        bVar3 = receivedPayload[local_2c];
        bVar1 = receivedPayload[local_2c + 1];
        uVar7 = local_2c + 2;
        uVar4 = (byte)receivedPayload[local_2c + 1] & 0x7f;
        local_2c = uVar7 + uVar4;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"Literal Header Field with Incremental Indexing, index: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar3 & 0x3f);
        poVar5 = std::operator<<(poVar5,", at: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c - uVar4);
        poVar5 = std::operator<<(poVar5,", length: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
        poVar5 = std::operator<<(poVar5,", huffman: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 >> 7));
        std::operator<<(poVar5,", binary: ");
        for (valueString.field_2._8_8_ = 0; (ulong)valueString.field_2._8_8_ < (ulong)uVar4;
            valueString.field_2._8_8_ = valueString.field_2._8_8_ + 1) {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
          std::ostream::operator<<
                    (poVar5,(byte)(receivedPayload + uVar7)[valueString.field_2._8_8_] & 0xf);
        }
        handeBinary_abi_cxx11_
                  ((string *)local_110,this,receivedPayload + uVar7,uVar4,(bool)(bVar1 >> 7));
        std::__cxx11::string::string
                  ((string *)&local_130,
                   (string *)&StaticTable::static_table[(bVar3 & 0x3f) - 1].header_name);
        std::__cxx11::string::string((string *)&nameLength_1,(string *)local_110);
        Header::setHeaderline(__return_storage_ptr__,&local_130,(string *)&nameLength_1);
        std::__cxx11::string::~string((string *)&nameLength_1);
        std::__cxx11::string::~string((string *)&local_130);
        poVar5 = std::operator<<((ostream *)&std::cout,", name: ");
        std::operator<<(poVar5,(string *)local_110);
        std::__cxx11::string::~string((string *)local_110);
      }
      else if (((int)receivedPayload[local_2c] & 0xf0U) == 0) {
        bVar3 = receivedPayload[local_2c];
        bVar1 = receivedPayload[local_2c + 1];
        uVar7 = local_2c + 2;
        uVar4 = (byte)receivedPayload[local_2c + 1] & 0x7f;
        local_2c = uVar7 + uVar4;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"Literal Header Field without Indexing: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar3 & 0xf);
        poVar5 = std::operator<<(poVar5,", at: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c - uVar4);
        poVar5 = std::operator<<(poVar5,", length: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
        poVar5 = std::operator<<(poVar5,", huffman: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 >> 7));
        std::operator<<(poVar5,", binary: ");
        for (valueString_1.field_2._8_8_ = 0; (ulong)valueString_1.field_2._8_8_ < (ulong)uVar4;
            valueString_1.field_2._8_8_ = valueString_1.field_2._8_8_ + 1) {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
          std::ostream::operator<<
                    (poVar5,(byte)(receivedPayload + uVar7)[valueString_1.field_2._8_8_] & 0xf);
        }
        handeBinary_abi_cxx11_
                  ((string *)local_190,this,receivedPayload + uVar7,uVar4,(bool)(bVar1 >> 7));
        std::__cxx11::string::string
                  ((string *)&local_1b0,
                   (string *)&StaticTable::static_table[(bVar3 & 0xf) - 1].header_name);
        std::__cxx11::string::string((string *)&nameLength_2,(string *)local_190);
        Header::setHeaderline(__return_storage_ptr__,&local_1b0,(string *)&nameLength_2);
        std::__cxx11::string::~string((string *)&nameLength_2);
        std::__cxx11::string::~string((string *)&local_1b0);
        poVar5 = std::operator<<((ostream *)&std::cout,", name: ");
        std::operator<<(poVar5,(string *)local_190);
        std::__cxx11::string::~string((string *)local_190);
      }
      else if (((int)receivedPayload[local_2c] & 0xf0U) == 0x10) {
        bVar3 = receivedPayload[local_2c];
        cVar2 = receivedPayload[local_2c + 1];
        uVar7 = local_2c + 2;
        uVar4 = (byte)receivedPayload[local_2c + 1] & 0x7f;
        local_2c = uVar7 + uVar4;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"Literal Header Field Never Indexed, index: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar3 & 0xf);
        poVar5 = std::operator<<(poVar5,", at: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c - uVar4);
        poVar5 = std::operator<<(poVar5,", length: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
        poVar5 = std::operator<<(poVar5,", huffman: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)-(cVar2 >> 7));
        std::operator<<(poVar5,", binary: ");
        for (valueString_2.field_2._8_8_ = 0; (ulong)valueString_2.field_2._8_8_ < (ulong)uVar4;
            valueString_2.field_2._8_8_ = valueString_2.field_2._8_8_ + 1) {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
          std::ostream::operator<<
                    (poVar5,(byte)(receivedPayload + uVar7)[valueString_2.field_2._8_8_] & 0xf);
        }
        handeBinary_abi_cxx11_
                  ((string *)local_210,this,receivedPayload + uVar7,uVar4,(bool)-(cVar2 >> 7));
        std::__cxx11::string::string
                  ((string *)&local_230,
                   (string *)&StaticTable::static_table[(bVar3 & 0xf) - 1].header_name);
        std::__cxx11::string::string((string *)&m,(string *)local_210);
        Header::setHeaderline(__return_storage_ptr__,&local_230,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_230);
        poVar5 = std::operator<<((ostream *)&std::cout,", name: ");
        std::operator<<(poVar5,(string *)local_210);
        std::__cxx11::string::~string((string *)local_210);
      }
      else if (((int)receivedPayload[local_2c] & 0xe0U) == 0x20) {
        uStack_254 = (int)receivedPayload[local_2c] & 0x1f;
        bVar3 = 0;
        bVar8 = true;
        uVar4 = local_2c;
        while (local_2c = uVar4 + 1, bVar8) {
          uStack_254 = (((int)receivedPayload[local_2c] & 0x7fU) << (bVar3 & 0x1f)) + uStack_254;
          bVar3 = bVar3 + 7;
          bVar8 = (int)((int)receivedPayload[local_2c] & 0x80U) >> 7 != 0;
          uVar4 = local_2c;
        }
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"Dynamic Table Size Update, newSize: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uStack_254);
        poVar5 = std::operator<<(poVar5,", at: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
        std::ostream::operator<<(poVar5,uVar4 - 2);
      }
    }
    else {
      uVar6 = (ulong)local_2c;
      local_2c = local_2c + 1;
      line.header_value.field_2._12_4_ = (byte)receivedPayload[uVar6] & 0x7f;
      StaticTableLine::StaticTableLine
                ((StaticTableLine *)local_90,
                 StaticTable::static_table + (line.header_value.field_2._12_4_ - 1));
      std::__cxx11::string::string((string *)&local_b0,(string *)&line);
      std::__cxx11::string::string
                ((string *)&nameLength,(string *)(line.header_name.field_2._M_local_buf + 8));
      Header::setHeaderline(__return_storage_ptr__,&local_b0,(string *)&nameLength);
      std::__cxx11::string::~string((string *)&nameLength);
      std::__cxx11::string::~string((string *)&local_b0);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"Indexed Header Field Representation, index: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,line.header_value.field_2._12_4_);
      poVar5 = std::operator<<(poVar5,", at: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
      std::ostream::operator<<(poVar5,local_2c);
      StaticTableLine::~StaticTableLine((StaticTableLine *)local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Header Hpack::decodeHTTP2Header(char *receivedPayload, unsigned int length) {
  Header header;
  unsigned int iterator = 0;
  
  //prints out compressed header start
  std::cout << std::endl << "Header binary: ";
  for (unsigned int i = 0; i < length;i++) {std::cout << std::hex << ((int)receivedPayload[i] & 0xFF);}
  std::cout << std::endl;
  //prints out compressed header end
  
  while (iterator < length) {
    
    //Indexed Header Field Representation
    if ((receivedPayload[iterator] & 0x80) >> 7) {
      unsigned int index = receivedPayload[iterator++] & 0x7F;
      
      StaticTableLine line = StaticTable::static_table[index - 1];
      header.setHeaderline(line.header_name, line.header_value);
      
      std::cout << std::endl << "Indexed Header Field Representation, index: " << index << ", at: "  << std::dec << iterator;
    }
    
    //Literal Header Field with Incremental Indexing
    else if ((receivedPayload[iterator] & 0xC0) == 0x40) {
      unsigned int index = receivedPayload[iterator++] & 0x3F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field with Incremental Indexing, index: " << index << ", at: " << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field without Indexing
    else if ((receivedPayload[iterator] & 0xF0) == 0x00) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field without Indexing: " << index << ", at: "  << std::dec << iterator  - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field Never Indexed
    else if ((receivedPayload[iterator] & 0xF0) == 0x10) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char *stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field Never Indexed, index: " << index << ", at: "  << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      if (huffman) {
        //Huffman::decode(stringData, nameLength);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Dynamic Table Size Update
    else if ((receivedPayload[iterator] & 0xE0) == 0x20) {
      unsigned int dynamicTableSizeUpdate = receivedPayload[iterator++] & 0x1F, m = 0;
      
      bool continuation = true;
      while (continuation) {
        dynamicTableSizeUpdate += (receivedPayload[iterator] & 0x7F) << m;
        m += 7;
        continuation = (receivedPayload[iterator++] & 0x80) >> 7;
      }
      
      std::cout << std::endl << "Dynamic Table Size Update, newSize: " << std::dec << dynamicTableSizeUpdate << ", at: "  << std::dec << iterator - 3;
      
      /*
      decode I from the next N bits
      if I < 2^N - 1, return I
      else
          M = 0
          repeat
              B = next octet
              I = I + (B & 127) * 2^M
              M = M + 7
          while B & 128 == 128
          return I
       */
      
    }
  }
  
  return header;
}